

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O0

void UpdateBuffer(float *frame,size_t frame_length,size_t buffer_length,float *buffer)

{
  float *buffer_local;
  size_t buffer_length_local;
  size_t frame_length_local;
  float *frame_local;
  
  if (buffer_length < frame_length << 1) {
    memcpy(buffer,buffer + frame_length,(buffer_length - frame_length) * 4);
    if (frame == (float *)0x0) {
      memset(buffer + (buffer_length - frame_length),0,frame_length << 2);
    }
    else {
      memcpy(buffer + (buffer_length - frame_length),frame,frame_length << 2);
    }
    return;
  }
  __assert_fail("buffer_length < 2 * frame_length",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                ,0x35c,"void UpdateBuffer(const float *, size_t, size_t, float *)");
}

Assistant:

static void UpdateBuffer(const float* frame,
                         size_t frame_length,
                         size_t buffer_length,
                         float* buffer) {
  assert(buffer_length < 2 * frame_length);

  memcpy(buffer,
         buffer + frame_length,
         sizeof(*buffer) * (buffer_length - frame_length));
  if (frame) {
    memcpy(buffer + buffer_length - frame_length,
           frame,
           sizeof(*buffer) * frame_length);
  } else {
    memset(buffer + buffer_length - frame_length,
           0,
           sizeof(*buffer) * frame_length);
  }
}